

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O3

void __thiscall p2t::Sweep::~Sweep(Sweep *this)

{
  pointer ppNVar1;
  ulong uVar2;
  
  ppNVar1 = (this->nodes_).super__Vector_base<p2t::Node_*,_std::allocator<p2t::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->nodes_).super__Vector_base<p2t::Node_*,_std::allocator<p2t::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppNVar1) {
    uVar2 = 0;
    do {
      operator_delete(ppNVar1[uVar2]);
      uVar2 = uVar2 + 1;
      ppNVar1 = (this->nodes_).super__Vector_base<p2t::Node_*,_std::allocator<p2t::Node_*>_>._M_impl
                .super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->nodes_).
                                   super__Vector_base<p2t::Node_*,_std::allocator<p2t::Node_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar1 >> 3));
  }
  if (ppNVar1 != (pointer)0x0) {
    operator_delete(ppNVar1);
    return;
  }
  return;
}

Assistant:

Sweep::~Sweep() {

    // Clean up memory
    for(size_t i = 0; i < nodes_.size(); i++) {
        delete nodes_[i];
    }

}